

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonwriter.cpp
# Opt level: O3

void __thiscall CJsonWriter::WriteIndent(CJsonWriter *this,bool EndElement)

{
  IOHANDLE pIVar1;
  uint uVar2;
  int iVar3;
  
  if (this->m_NumStates != 0) {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/jsonwriter.cpp"
                   ,0xc6,1,"json stack is empty");
    if (this->m_aStates[(long)this->m_NumStates + -1].m_Kind != '\x03') {
      dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/jsonwriter.cpp"
                     ,0xc6,(uint)(this->m_NumStates != 0),"json stack is empty");
      if (!EndElement && this->m_aStates[(long)this->m_NumStates + -1].m_Empty == false) {
        pIVar1 = this->m_IO;
        uVar2 = str_length(",");
        io_write(pIVar1,",",uVar2);
      }
      io_write_newline(this->m_IO);
      if (this->m_Indentation < 1) {
        return;
      }
      iVar3 = 0;
      do {
        pIVar1 = this->m_IO;
        uVar2 = str_length("\t");
        io_write(pIVar1,"\t",uVar2);
        iVar3 = iVar3 + 1;
      } while (iVar3 < this->m_Indentation);
      return;
    }
  }
  if (!EndElement) {
    return;
  }
  io_write_newline(this->m_IO);
  return;
}

Assistant:

void CJsonWriter::WriteIndent(bool EndElement)
{
	const bool NotRootOrAttribute = m_NumStates != 0
		&& TopState()->m_Kind != STATE_ATTRIBUTE;

	if(NotRootOrAttribute && !TopState()->m_Empty && !EndElement)
		WriteInternal(",");

	if(NotRootOrAttribute || EndElement)
		io_write_newline(m_IO);

	if(NotRootOrAttribute)
		for(int i = 0; i < m_Indentation; i++)
			WriteInternal("\t");
}